

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

void __thiscall QSqlTableModelPrivate::revertCachedRow(QSqlTableModelPrivate *this,int row)

{
  bool bVar1;
  Op OVar2;
  ModifiedRow *this_00;
  QSqlTableModelPrivate *in_RDI;
  long in_FS_OFFSET;
  int oldKey;
  QSqlTableModel *q;
  Iterator it;
  ModifiedRow oldValue;
  ModifiedRow r;
  ModifiedRow *in_stack_fffffffffffffe48;
  ModifiedRow *in_stack_fffffffffffffe50;
  QModelIndex *in_stack_fffffffffffffe58;
  CacheMap *this_01;
  ModifiedRow *in_stack_fffffffffffffe60;
  QMap<int,_QSqlTableModelPrivate::ModifiedRow> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  const_iterator in_stack_fffffffffffffe78;
  ModifiedRow *pMVar3;
  undefined1 local_d8 [24];
  undefined1 local_c0 [24];
  undefined1 local_a8 [24];
  undefined1 local_90 [40];
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  ModifiedRow local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (ModifiedRow *)q_func(in_RDI);
  local_28.m_db_values.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
  local_28.m_submitted = true;
  local_28.m_insert = true;
  local_28._26_6_ = 0xaaaaaaaaaaaa;
  local_28.m_op = 0xaaaaaaaa;
  local_28._4_4_ = 0xaaaaaaaa;
  local_28.m_rec.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
  QSqlRecord::QSqlRecord((QSqlRecord *)in_stack_fffffffffffffe50);
  ModifiedRow::ModifiedRow
            (in_stack_fffffffffffffe60,(Op)((ulong)in_stack_fffffffffffffe58 >> 0x20),
             (QSqlRecord *)in_stack_fffffffffffffe50);
  QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
            ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (int *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  ModifiedRow::~ModifiedRow(in_stack_fffffffffffffe50);
  QSqlRecord::~QSqlRecord((QSqlRecord *)0x16bc26);
  OVar2 = ModifiedRow::op(&local_28);
  if (OVar2 != None) {
    if (OVar2 == Insert) {
      QMap<int,_QSqlTableModelPrivate::ModifiedRow>::find
                (in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60);
      QMap<int,_QSqlTableModelPrivate::ModifiedRow>::end
                ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)in_stack_fffffffffffffe60);
      bVar1 = ::operator==((iterator *)in_stack_fffffffffffffe50,
                           (iterator *)in_stack_fffffffffffffe48);
      if (!bVar1) {
        QModelIndex::QModelIndex((QModelIndex *)0x16be08);
        QSqlQueryModel::beginRemoveRows
                  ((QSqlQueryModel *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   (int)((ulong)this_00 >> 0x20),(int)this_00);
        this_01 = &in_RDI->cache;
        QMap<int,_QSqlTableModelPrivate::ModifiedRow>::const_iterator::const_iterator
                  ((const_iterator *)this_00,(iterator *)in_stack_fffffffffffffe48);
        QMap<int,_QSqlTableModelPrivate::ModifiedRow>::erase
                  (this_01,(const_iterator)in_stack_fffffffffffffe78._M_node);
        while( true ) {
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::end
                    ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)in_stack_fffffffffffffe60);
          bVar1 = ::operator!=((iterator *)this_00,(iterator *)in_stack_fffffffffffffe48);
          if (!bVar1) break;
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::iterator::key((iterator *)0x16bebb);
          local_68 = 0xaaaaaaaaaaaaaaaa;
          local_60 = 0xaaaaaaaaaaaaaaaa;
          local_58 = 0xaaaaaaaaaaaaaaaa;
          local_50 = 0xaaaaaaaaaaaaaaaa;
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::iterator::value((iterator *)0x16bf0a);
          ModifiedRow::ModifiedRow(this_00,in_stack_fffffffffffffe48);
          in_stack_fffffffffffffe48 = (ModifiedRow *)&in_RDI->cache;
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::const_iterator::const_iterator
                    ((const_iterator *)this_00,(iterator *)in_stack_fffffffffffffe48);
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::erase
                    (this_01,(const_iterator)in_stack_fffffffffffffe78._M_node);
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::insert
                    ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)in_stack_fffffffffffffe60,
                     (int *)this_01,this_00);
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::iterator::operator++((iterator *)this_00);
          ModifiedRow::~ModifiedRow(this_00);
        }
        QSqlQueryModel::endRemoveRows((QSqlQueryModel *)this_00);
        in_stack_fffffffffffffe50 = this_00;
      }
    }
    else if ((OVar2 - Update < 2) && (bVar1 = ModifiedRow::submitted(&local_28), !bVar1)) {
      QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
                ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)in_RDI,
                 (int *)in_stack_fffffffffffffe78._M_node);
      ModifiedRow::revert(in_stack_fffffffffffffe50);
      pMVar3 = this_00;
      QAbstractItemModel::createIndex
                ((QAbstractItemModel *)in_stack_fffffffffffffe60,
                 (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)in_stack_fffffffffffffe58,
                 in_stack_fffffffffffffe50);
      QModelIndex::QModelIndex((QModelIndex *)0x16bcf5);
      (**(code **)(*(long *)this_00 + 0x80))(this_00,local_c0);
      QAbstractItemModel::createIndex
                ((QAbstractItemModel *)this_00,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 (int)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      memset(local_d8,0,0x18);
      QList<int>::QList((QList<int> *)0x16bd4c);
      QAbstractItemModel::dataChanged
                ((QModelIndex *)pMVar3,(QModelIndex *)local_90,(QList_conflict *)local_a8);
      QList<int>::~QList((QList<int> *)0x16bd7b);
    }
  }
  ModifiedRow::~ModifiedRow(in_stack_fffffffffffffe50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSqlTableModelPrivate::revertCachedRow(int row)
{
    Q_Q(QSqlTableModel);
    ModifiedRow r = cache.value(row);

    switch (r.op()) {
    case QSqlTableModelPrivate::None:
        Q_ASSERT_X(false, "QSqlTableModelPrivate::revertCachedRow()", "Invalid entry in cache map");
        return;
    case QSqlTableModelPrivate::Update:
    case QSqlTableModelPrivate::Delete:
        if (!r.submitted()) {
            cache[row].revert();
            emit q->dataChanged(q->createIndex(row, 0),
                                q->createIndex(row, q->columnCount() - 1));
        }
        break;
    case QSqlTableModelPrivate::Insert: {
            QMap<int, QSqlTableModelPrivate::ModifiedRow>::Iterator it = cache.find(row);
            if (it == cache.end())
                return;
            q->beginRemoveRows(QModelIndex(), row, row);
            it = cache.erase(it);
            while (it != cache.end()) {
                int oldKey = it.key();
                const QSqlTableModelPrivate::ModifiedRow oldValue = it.value();
                cache.erase(it);
                it = cache.insert(oldKey - 1, oldValue);
                ++it;
            }
            q->endRemoveRows();
        break; }
    }
}